

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O1

MethodOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (MethodOptions *__return_storage_ptr__,MethodDescriptor *descriptor)

{
  MethodOptions options;
  MethodOptions local_70;
  
  MethodOptions::MethodOptions(&local_70,(Arena *)0x0,descriptor->options_);
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&local_70.super_Message,descriptor->service_->file_->pool_,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0);
  MethodOptions::MethodOptions(__return_storage_ptr__,(Arena *)0x0,&local_70);
  MethodOptions::~MethodOptions(&local_70);
  return __return_storage_ptr__;
}

Assistant:

MethodOptions StripLocalSourceRetentionOptions(
    const MethodDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}